

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void tcu::astc::generateRandomBlocks
               (deUint8 *dst,size_t numBlocks,CompressedTexFormat format,deUint32 seed)

{
  IVec3 blockSize;
  Random rnd;
  IVec3 local_44;
  deRandom local_38;
  
  getBlockPixelSize((tcu *)&local_44,format);
  deRandom_init(&local_38,seed);
  if (numBlocks != 0) {
    do {
      anon_unknown_0::generateRandomBlock(dst,&local_44,(Random *)&local_38);
      dst = dst + 0x10;
      numBlocks = numBlocks - 1;
    } while (numBlocks != 0);
  }
  return;
}

Assistant:

void generateRandomBlocks (deUint8* dst, size_t numBlocks, CompressedTexFormat format, deUint32 seed)
{
	const IVec3		blockSize			= getBlockPixelSize(format);
	de::Random		rnd					(seed);
	size_t			numBlocksGenerated	= 0;

	DE_ASSERT(isAstcFormat(format));
	DE_ASSERT(blockSize.z() == 1);

	for (numBlocksGenerated = 0; numBlocksGenerated < numBlocks; numBlocksGenerated++)
	{
		deUint8* const	curBlockPtr		= dst + numBlocksGenerated*BLOCK_SIZE_BYTES;

		generateRandomBlock(curBlockPtr, blockSize, rnd);
	}
}